

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

type_of_iterator * __thiscall
roaring::Roaring64MapSetBitBiDirectionalIterator::operator++
          (Roaring64MapSetBitBiDirectionalIterator *this)

{
  byte bVar1;
  _Base_ptr p_Var2;
  
  bVar1 = (this->i).has_value;
  if ((bool)bVar1 == true) {
    roaring_uint32_iterator_advance((roaring_uint32_iterator_t *)&this->i);
    bVar1 = (this->i).has_value;
  }
  if ((bVar1 & 1) == 0) {
    do {
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((this->map_iter)._M_node);
      (this->map_iter)._M_node = p_Var2;
      if ((_Rb_tree_header *)p_Var2 == &(this->p->_M_t)._M_impl.super__Rb_tree_header) {
        return this;
      }
      roaring_iterator_init
                ((roaring_bitmap_t *)&p_Var2[1]._M_parent,(roaring_uint32_iterator_t *)&this->i);
    } while ((this->i).has_value != true);
  }
  return this;
}

Assistant:

type_of_iterator &operator++() {  // ++i, must returned inc. value
        if (i.has_value == true) roaring_uint32_iterator_advance(&i);
        while (!i.has_value) {
            ++map_iter;
            if (map_iter == p->cend()) return *this;
            roaring_iterator_init(&map_iter->second.roaring, &i);
        }
        return *this;
    }